

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mustache.cpp
# Opt level: O3

QString * decorate(QString *__return_storage_ptr__,QString *text,Renderer *r,Context *ctx)

{
  QByteArrayView QVar1;
  QByteArrayView QVar2;
  QString t;
  QArrayData *local_58;
  char16_t *local_50;
  qsizetype local_48;
  QString local_40;
  QArrayData *local_28 [3];
  
  Mustache::Renderer::render(&local_40,r,text,ctx);
  QVar1.m_data = (storage_type *)0x1;
  QVar1.m_size = (qsizetype)&local_58;
  QString::fromUtf8(QVar1);
  QString::append((QString *)&local_58);
  (__return_storage_ptr__->d).d = (Data *)local_58;
  (__return_storage_ptr__->d).ptr = local_50;
  (__return_storage_ptr__->d).size = local_48;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&local_58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
         (((QArrayData *)&local_58->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar2.m_data = (storage_type *)0x1;
  QVar2.m_size = (qsizetype)local_28;
  QString::fromUtf8(QVar2);
  QString::append((QString *)__return_storage_ptr__);
  if (local_28[0] != (QArrayData *)0x0) {
    LOCK();
    (local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_28[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_28[0],2,8);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static QString decorate(const QString& text, Mustache::Renderer* r, Mustache::Context* ctx)
{
	return "~" + r->render(text, ctx) + "~";
}